

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

int st__foreach(st__table *table,_func_st__retval_char_ptr_char_ptr_char_ptr *func,char *arg)

{
  st__table_entry *__ptr;
  st__retval sVar1;
  st__table_entry **ppsVar2;
  long lVar3;
  
  lVar3 = 0;
LAB_003da2af:
  if (table->num_bins <= lVar3) {
    return 1;
  }
  ppsVar2 = table->bins + lVar3;
LAB_003da2c6:
  do {
    __ptr = *ppsVar2;
    do {
      if (__ptr == (st__table_entry *)0x0) {
        lVar3 = lVar3 + 1;
        goto LAB_003da2af;
      }
      sVar1 = (*func)(__ptr->key,__ptr->record,arg);
      if (sVar1 == st__DELETE) {
        *ppsVar2 = __ptr->next;
        table->num_entries = table->num_entries + -1;
        free(__ptr);
        goto LAB_003da2c6;
      }
      if (sVar1 == st__STOP) {
        return 0;
      }
    } while (sVar1 != st__CONTINUE);
    ppsVar2 = &__ptr->next;
  } while( true );
}

Assistant:

int
 st__foreach( st__table *table, enum st__retval (*func)(char *, char *, char *), char *arg)
{
    st__table_entry *ptr, **last;
    enum st__retval retval;
    int i;

    for(i = 0; i < table->num_bins; i++) {
    last = &table->bins[i]; ptr = *last;
    while (ptr != NULL) {
        retval = (*func)(ptr->key, ptr->record, arg);
        switch (retval) {
        case st__CONTINUE:
        last = &ptr->next; ptr = *last;
        break;
        case st__STOP:
        return 0;
        case st__DELETE:
        *last = ptr->next;
        table->num_entries--;   /* cstevens@ic */
        ABC_FREE(ptr);
        ptr = *last;
        }
    }
    }
    return 1;
}